

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_packing_pass.cpp
# Opt level: O0

uint32_t __thiscall
spvtools::opt::StructPackingPass::getPackedAlignment(StructPackingPass *this,Type *type)

{
  bool bVar1;
  Kind KVar2;
  uint32_t uVar3;
  int iVar4;
  uint32_t uVar5;
  undefined4 extraout_var;
  Type *type_00;
  undefined4 extraout_var_00;
  vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  *this_00;
  reference ppTVar6;
  uint *puVar7;
  undefined4 extraout_var_01;
  Vector *this_02;
  Vector *vectorType;
  Matrix *matrixType;
  uint local_58;
  uint32_t baseAlignment;
  Type *local_50;
  Type *elementType;
  const_iterator __end3;
  const_iterator __begin3;
  vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  *__range3;
  uint32_t local_28;
  uint32_t alignment;
  Type *pTStack_20;
  uint32_t minAlignment;
  Type *type_local;
  StructPackingPass *this_local;
  Matrix *this_01;
  undefined4 extraout_var_02;
  
  pTStack_20 = type;
  type_local = (Type *)this;
  KVar2 = analysis::Type::kind(type);
  if (KVar2 == kArray) {
    bVar1 = isPackingVec4Padded(this->packingRules_);
    alignment = 1;
    if (bVar1) {
      alignment = 0x10;
    }
    iVar4 = (*pTStack_20->_vptr_Type[0x18])();
    type_00 = analysis::Array::element_type((Array *)CONCAT44(extraout_var,iVar4));
    local_28 = getPackedAlignment(this,type_00);
    puVar7 = std::max<unsigned_int>(&alignment,&local_28);
    this_local._4_4_ = *puVar7;
  }
  else if (KVar2 == kStruct) {
    __range3._4_4_ = 1;
    iVar4 = (*pTStack_20->_vptr_Type[0x1e])();
    this_00 = analysis::Struct::element_types((Struct *)CONCAT44(extraout_var_00,iVar4));
    __end3 = std::
             vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
             ::begin(this_00);
    elementType = (Type *)std::
                          vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                          ::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_spvtools::opt::analysis::Type_*const_*,_std::vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>_>
                                       *)&elementType), bVar1) {
      ppTVar6 = __gnu_cxx::
                __normal_iterator<const_spvtools::opt::analysis::Type_*const_*,_std::vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>_>
                ::operator*(&__end3);
      local_50 = *ppTVar6;
      baseAlignment = getPackedAlignment(this,local_50);
      puVar7 = std::max<unsigned_int>((uint *)((long)&__range3 + 4),&baseAlignment);
      __range3._4_4_ = *puVar7;
      __gnu_cxx::
      __normal_iterator<const_spvtools::opt::analysis::Type_*const_*,_std::vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>_>
      ::operator++(&__end3);
    }
    bVar1 = isPackingVec4Padded(this->packingRules_);
    if (bVar1) {
      local_58 = 0x10;
      puVar7 = std::max<unsigned_int>((uint *)((long)&__range3 + 4),&local_58);
      __range3._4_4_ = *puVar7;
    }
    this_local._4_4_ = __range3._4_4_;
  }
  else {
    uVar3 = getPackedBaseSize(pTStack_20);
    bVar1 = isPackingScalar(this->packingRules_);
    this_local._4_4_ = uVar3;
    if (!bVar1) {
      iVar4 = (*pTStack_20->_vptr_Type[0x10])();
      this_01 = (Matrix *)CONCAT44(extraout_var_01,iVar4);
      if (this_01 == (Matrix *)0x0) {
        iVar4 = (*pTStack_20->_vptr_Type[0xe])();
        this_02 = (Vector *)CONCAT44(extraout_var_02,iVar4);
        if ((this_02 != (Vector *)0x0) &&
           (uVar5 = analysis::Vector::element_count(this_02), uVar5 != 1)) {
          uVar5 = analysis::Vector::element_count(this_02);
          if ((uVar5 == 2) || (uVar5 = analysis::Vector::element_count(this_02), uVar5 == 4)) {
            uVar5 = analysis::Vector::element_count(this_02);
            this_local._4_4_ = uVar3 * uVar5;
          }
          else {
            uVar5 = analysis::Vector::element_count(this_02);
            if (uVar5 != 3) {
              __assert_fail("0 && \"Unrecognized type to get packed alignment\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/struct_packing_pass.cpp"
                            ,0xde,
                            "uint32_t spvtools::opt::StructPackingPass::getPackedAlignment(const analysis::Type &) const"
                           );
            }
            this_local._4_4_ = uVar3 << 2;
          }
        }
      }
      else {
        bVar1 = isPackingVec4Padded(this->packingRules_);
        if ((bVar1) || (uVar5 = analysis::Matrix::element_count(this_01), uVar5 == 3)) {
          this_local._4_4_ = uVar3 << 2;
        }
        else {
          uVar5 = analysis::Matrix::element_count(this_01);
          this_local._4_4_ = uVar3 * uVar5;
        }
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

uint32_t StructPackingPass::getPackedAlignment(
    const analysis::Type& type) const {
  switch (type.kind()) {
    case analysis::Type::kArray: {
      // Get alignment of base type and round up to minimum alignment
      const uint32_t minAlignment = isPackingVec4Padded(packingRules_) ? 16 : 1;
      return std::max<uint32_t>(
          minAlignment, getPackedAlignment(*type.AsArray()->element_type()));
    }
    case analysis::Type::kStruct: {
      // Rule 9. Struct alignment is maximum alignmnet of its members
      uint32_t alignment = 1;

      for (const analysis::Type* elementType :
           type.AsStruct()->element_types()) {
        alignment =
            std::max<uint32_t>(alignment, getPackedAlignment(*elementType));
      }

      if (isPackingVec4Padded(packingRules_))
        alignment = std::max<uint32_t>(alignment, 16u);

      return alignment;
    }
    default: {
      const uint32_t baseAlignment = getPackedBaseSize(type);

      // Scalar block layout always uses alignment for the most basic component
      if (isPackingScalar(packingRules_)) return baseAlignment;

      if (const analysis::Matrix* matrixType = type.AsMatrix()) {
        // Rule 5/7
        if (isPackingVec4Padded(packingRules_) ||
            matrixType->element_count() == 3)
          return baseAlignment * 4;
        else
          return baseAlignment * matrixType->element_count();
      } else if (const analysis::Vector* vectorType = type.AsVector()) {
        // Rule 1
        if (vectorType->element_count() == 1) return baseAlignment;

        // Rule 2
        if (vectorType->element_count() == 2 ||
            vectorType->element_count() == 4)
          return baseAlignment * vectorType->element_count();

        // Rule 3
        if (vectorType->element_count() == 3) return baseAlignment * 4;
      } else {
        // Rule 1
        return baseAlignment;
      }
    }
  }
  assert(0 && "Unrecognized type to get packed alignment");
  return 0;
}